

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::Scope<hgdb::json::Module>::~Scope(Scope<hgdb::json::Module> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ScopeBase)._vptr_ScopeBase = (_func_int **)&PTR_serialize_002aabd0;
  pcVar2 = (this->condition)._M_dataplus._M_p;
  paVar1 = &(this->condition).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->filename)._M_dataplus._M_p;
  paVar1 = &(this->filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_ScopeBase)._vptr_ScopeBase = (_func_int **)&PTR___cxa_pure_virtual_002aac10;
  std::
  vector<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
  ::~vector(&(this->super_ScopeBase).scopes_);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit Scope(uint32_t line) : line_num(line) {}